

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_quad_rule.cc
# Opt level: O3

QuadRule * lf::quad::make_QuadRule(QuadRule *__return_storage_ptr__,RefEl ref_el,uint degree)

{
  long lVar1;
  runtime_error *this;
  Index col;
  double *pdVar2;
  undefined8 uVar3;
  uint uVar4;
  MatrixXd points2d_1;
  MatrixXd points2d;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  int local_2e4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_2a8;
  undefined1 local_288 [8];
  variable_if_dynamic<long,__1> local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_278;
  RhsNested local_268;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  VectorXd local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  MatrixXd local_210;
  MatrixXd local_1f8;
  VectorXd local_1e0;
  MatrixXd local_1d0;
  undefined1 local_1b8 [16];
  variable_if_dynamic<long,__1> local_1a8;
  XprTypeNested local_1a0;
  scalar_constant_op<double> local_198;
  NestedExpressionType local_190;
  
  if (ref_el.type_ == kQuad) {
    uVar4 = (degree >> 1) + 1;
    GaussLegendre((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)&local_2e0,uVar4);
    local_308._M_allocated_capacity = 0;
    local_308._8_8_ = 0;
    local_2f8._M_allocated_capacity = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_308,2,
               (ulong)(uVar4 * uVar4));
    local_1b8._0_8_ = &DAT_3ff0000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      *)&local_248,1,(Index)(ulong)uVar4,(scalar_constant_op<double> *)local_1b8);
    local_280.m_value = local_248._M_allocated_capacity;
    aStack_278._M_allocated_capacity = local_248._8_8_;
    aStack_278._8_8_ = local_238._M_allocated_capacity;
    local_288 = (undefined1  [8])local_2d0;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1b8,
               (Matrix<double,__1,__1,_0,__1,__1> *)&local_308,0);
    Eigen::
    KroneckerProduct<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>>>
    ::evalTo<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
              ((KroneckerProduct<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                *)local_288,
               (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1b8);
    local_280.m_value = 1;
    local_288 = (undefined1  [8])local_2d0;
    aStack_278._M_allocated_capacity = (size_type)(XprTypeNested)(ulong)uVar4;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1b8,
               (Matrix<double,__1,__1,_0,__1,__1> *)&local_308,1);
    uVar3 = local_2d0[0]._M_allocated_capacity;
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,_1,_1>,double,double>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1b8,
               (Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,__1> *)
               local_288,(assign_op<double,_double> *)local_248._M_local_buf);
    if (0 < local_1a8.m_value) {
      lVar1 = (local_1a0->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
              m_storage.m_rows;
      pdVar2 = (double *)0x0;
      do {
        *(double *)local_1b8._0_8_ =
             *(double *)(uVar3 + ((long)pdVar2 % (long)local_2d0[0]._8_8_) * 8);
        pdVar2 = (double *)((long)pdVar2 + 1);
        local_1b8._0_8_ = local_1b8._0_8_ + lVar1 * 8;
      } while ((double *)local_1a8.m_value != pdVar2);
    }
    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)local_308._M_allocated_capacity;
    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         local_308._8_8_;
    local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         local_2f8._M_allocated_capacity;
    local_308._M_allocated_capacity = 0;
    local_308._8_8_ = 0;
    local_2f8._M_allocated_capacity = 0;
    local_258.m_storage.m_data = (double *)0x0;
    local_258.m_storage.m_rows = 0;
    local_1b8._0_8_ = &local_2e0;
    local_1b8._8_8_ = &local_2e0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&local_258,local_2e0._8_8_ * local_2e0._8_8_,1);
    Eigen::KroneckerProduct<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Matrix<double,-1,1,0,-1,1>>::
    evalTo<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((KroneckerProduct<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                *)local_1b8,(Matrix<double,__1,_1,_0,__1,_1> *)&local_258);
    QuadRule::QuadRule(__return_storage_ptr__,(RefEl)0x4,&local_1f8,(VectorXd *)&local_258,
                       uVar4 * 2 - 1);
    free(local_258.m_storage.m_data);
    free(local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
    free((void *)local_308._M_allocated_capacity);
    free((void *)local_2d0[0]._0_8_);
    uVar3 = local_2e0._M_allocated_capacity;
  }
  else if (ref_el.type_ == kTria) {
    switch(degree) {
    case 1:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,1>();
      return __return_storage_ptr__;
    case 2:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,2>();
      return __return_storage_ptr__;
    case 3:
    case 4:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,4>();
      return __return_storage_ptr__;
    case 5:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,5>();
      return __return_storage_ptr__;
    case 6:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,6>();
      return __return_storage_ptr__;
    case 7:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,7>();
      return __return_storage_ptr__;
    case 8:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,8>();
      return __return_storage_ptr__;
    case 9:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,9>();
      return __return_storage_ptr__;
    case 10:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,10>();
      return __return_storage_ptr__;
    case 0xb:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,11>();
      return __return_storage_ptr__;
    case 0xc:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,12>();
      return __return_storage_ptr__;
    case 0xd:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,13>();
      return __return_storage_ptr__;
    case 0xe:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,14>();
      return __return_storage_ptr__;
    case 0xf:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,15>();
      return __return_storage_ptr__;
    case 0x10:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,16>();
      return __return_storage_ptr__;
    case 0x11:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,17>();
      return __return_storage_ptr__;
    case 0x12:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,18>();
      return __return_storage_ptr__;
    case 0x13:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,19>();
      return __return_storage_ptr__;
    case 0x14:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,20>();
      return __return_storage_ptr__;
    case 0x15:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,21>();
      return __return_storage_ptr__;
    case 0x16:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,22>();
      return __return_storage_ptr__;
    case 0x17:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,23>();
      return __return_storage_ptr__;
    case 0x18:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,24>();
      return __return_storage_ptr__;
    case 0x19:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,25>();
      return __return_storage_ptr__;
    case 0x1a:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,26>();
      return __return_storage_ptr__;
    case 0x1b:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,27>();
      return __return_storage_ptr__;
    case 0x1c:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,28>();
      return __return_storage_ptr__;
    case 0x1d:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,29>();
      return __return_storage_ptr__;
    case 0x1e:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,30>();
      return __return_storage_ptr__;
    case 0x1f:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,31>();
      return __return_storage_ptr__;
    case 0x20:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,32>();
      return __return_storage_ptr__;
    case 0x21:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,33>();
      return __return_storage_ptr__;
    case 0x22:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,34>();
      return __return_storage_ptr__;
    case 0x23:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,35>();
      return __return_storage_ptr__;
    case 0x24:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,36>();
      return __return_storage_ptr__;
    case 0x25:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,37>();
      return __return_storage_ptr__;
    case 0x26:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,38>();
      return __return_storage_ptr__;
    case 0x27:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,39>();
      return __return_storage_ptr__;
    case 0x28:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,40>();
      return __return_storage_ptr__;
    case 0x29:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,41>();
      return __return_storage_ptr__;
    case 0x2a:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,42>();
      return __return_storage_ptr__;
    case 0x2b:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,43>();
      return __return_storage_ptr__;
    case 0x2c:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,44>();
      return __return_storage_ptr__;
    case 0x2d:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,45>();
      return __return_storage_ptr__;
    case 0x2e:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,46>();
      return __return_storage_ptr__;
    case 0x2f:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,47>();
      return __return_storage_ptr__;
    case 0x30:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,48>();
      return __return_storage_ptr__;
    case 0x31:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,49>();
      return __return_storage_ptr__;
    case 0x32:
      detail::HardcodedQuadRule<(lf::base::RefElType)3,50>();
      return __return_storage_ptr__;
    default:
      uVar4 = (degree >> 1) + 1;
      GaussLegendre((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)&local_308,uVar4);
      GaussJacobi((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)&local_248,uVar4,1.0,0.0);
      local_2e4 = 1;
      local_288 = (undefined1  [8])&local_238;
      Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>>::operator+
                ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                  *)&local_2e0,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>> *)local_288,
                 &local_2e4);
      local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)&DAT_4000000000000000;
      Eigen::
      ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>>
      ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
                   *)local_1b8,
                  (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>>
                   *)local_2e0._M_local_buf,(double *)&local_2a8);
      local_218 = &local_238;
      Eigen::ArrayWrapper<Eigen::Matrix<double,-1,1,0,-1,1>>::operator=
                ((ArrayWrapper<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_218,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>_>
                  *)local_1b8);
      local_1b8._0_8_ = (double *)0x3fd0000000000000;
      local_2e0._M_allocated_capacity = (size_type)&local_248;
      Eigen::DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>::operator*=
                ((DenseBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
                 local_2e0._M_local_buf,(Scalar *)local_1b8);
      local_1b8._0_4_ = 2;
      local_2e0._M_allocated_capacity._0_4_ = uVar4 * uVar4;
      Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_int>
                ((Matrix<double,_1,_1,0,_1,_1> *)&local_2a8,(int *)local_1b8,
                 (uint *)&local_2e0._M_allocated_capacity);
      local_2e4 = 1;
      local_218 = &local_238;
      Eigen::operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                        *)local_288,&local_2e4,(StorageBaseType *)&local_218);
      local_1b8._0_8_ = &local_2f8;
      local_1a0 = (XprTypeNested)aStack_278._M_allocated_capacity;
      local_198.m_other = (double)aStack_278._8_8_;
      local_190.m_matrix = (non_const_type)local_268.m_expression.m_matrix;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&local_2e0,
                 &local_2a8,0);
      Eigen::
      KroneckerProduct<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,-1,1,1,-1>const>const,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>>>const>const>>
      ::evalTo<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
                ((KroneckerProduct<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>const>const>>
                  *)local_1b8,
                 (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&local_2e0);
      local_2d0[0]._0_8_ = ZEXT48(uVar4);
      local_2e0._8_8_ = 1;
      local_2e0._M_allocated_capacity = (size_type)&local_238;
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_1b8,
                 &local_2a8,1);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)local_1b8,
                 (DenseBase<Eigen::Replicate<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,__1,__1>_>
                  *)local_2e0._M_local_buf);
      local_210.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
      local_210.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows;
      local_210.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_cols;
      local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           0;
      local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           0;
      local_1b8._0_8_ = &local_308;
      local_1b8._8_8_ = &local_248;
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::ReturnByValue<Eigen::KroneckerProduct<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>>>
                ((Matrix<double,_1,1,0,_1,1> *)&local_228,
                 (EigenBase<Eigen::ReturnByValue<Eigen::KroneckerProduct<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)local_1b8);
      QuadRule::QuadRule(__return_storage_ptr__,(RefEl)0x3,&local_210,&local_228,uVar4 * 2 - 1);
      free(local_228.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          );
      free(local_210.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free(local_2a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      free((void *)local_238._M_allocated_capacity);
      free((void *)local_248._M_allocated_capacity);
      free((void *)local_2f8._M_allocated_capacity);
      uVar3 = local_308._M_allocated_capacity;
    }
  }
  else {
    if (ref_el.type_ != kSegment) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),
                 "No Quadrature rules implemented for this reference element yet.",0x3f);
      local_2e0._M_allocated_capacity = (size_type)local_2d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"false","");
      local_288 = (undefined1  [8])&aStack_278;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_288,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/quad/make_quad_rule.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed((string *)&local_2e0,(string *)local_288,0x9c,(string *)&local_308);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308._M_allocated_capacity != &local_2f8) {
        operator_delete((void *)local_308._M_allocated_capacity,local_2f8._M_allocated_capacity + 1)
        ;
      }
      if (local_288 != (undefined1  [8])&aStack_278) {
        operator_delete((void *)local_288,(ulong)(aStack_278._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_allocated_capacity != local_2d0) {
        operator_delete((void *)local_2e0._M_allocated_capacity,
                        local_2d0[0]._M_allocated_capacity + 1);
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"this code should not be reached");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar4 = (degree >> 1) + 1;
    GaussLegendre((tuple<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                   *)local_1b8,uVar4);
    local_2e0._M_allocated_capacity = (size_type)(local_1b8 + 0x10);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_1d0,
               (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
               local_2e0._M_local_buf);
    local_1e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)local_1b8._0_8_;
    local_1e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         local_1b8._8_8_;
    local_1b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_1b8._8_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    QuadRule::QuadRule(__return_storage_ptr__,(RefEl)0x2,&local_1d0,&local_1e0,(degree >> 1) + uVar4
                      );
    free(local_1e0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(local_1d0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
    free((void *)local_1a8.m_value);
    uVar3 = local_1b8._0_8_;
  }
  free((void *)uVar3);
  return __return_storage_ptr__;
}

Assistant:

QuadRule make_QuadRule(base::RefEl ref_el, unsigned degree) {
  if (ref_el == base::RefEl::kSegment()) {
    const quadDegree_t n = degree / 2 + 1;
    auto [points, weights] = GaussLegendre(n);
    return QuadRule(base::RefEl::kSegment(), points.transpose(),
                    std::move(weights), 2 * n - 1);
  }
  if (ref_el == base::RefEl::kQuad()) {
    const quadDegree_t n = degree / 2 + 1;
    auto [points1d, weights1d] = GaussLegendre(n);
    Eigen::MatrixXd points2d(2, n * n);
    points2d.row(0) = Eigen::kroneckerProduct(points1d.transpose(),
                                              Eigen::MatrixXd::Ones(1, n));
    points2d.row(1) = points1d.transpose().replicate(1, n);
    return QuadRule(base::RefEl::kQuad(), std::move(points2d),
                    Eigen::kroneckerProduct(weights1d, weights1d), 2 * n - 1);
  }
  if (ref_el == base::RefEl::kTria()) {
    switch (degree) {
      case 1:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 1>();
      case 2:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 2>();
      case 3:  // use degree 4 rule instead
      case 4:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 4>();
      case 5:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 5>();
      case 6:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 6>();
      case 7:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 7>();
      case 8:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 8>();
      case 9:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 9>();
      case 10:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 10>();
      case 11:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 11>();
      case 12:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 12>();
      case 13:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 13>();
      case 14:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 14>();
      case 15:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 15>();
      case 16:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 16>();
      case 17:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 17>();
      case 18:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 18>();
      case 19:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 19>();
      case 20:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 20>();
      case 21:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 21>();
      case 22:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 22>();
      case 23:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 23>();
      case 24:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 24>();
      case 25:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 25>();
      case 26:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 26>();
      case 27:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 27>();
      case 28:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 28>();
      case 29:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 29>();
      case 30:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 30>();
      case 31:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 31>();
      case 32:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 32>();
      case 33:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 33>();
      case 34:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 34>();
      case 35:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 35>();
      case 36:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 36>();
      case 37:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 37>();
      case 38:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 38>();
      case 39:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 39>();
      case 40:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 40>();
      case 41:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 41>();
      case 42:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 42>();
      case 43:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 43>();
      case 44:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 44>();
      case 45:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 45>();
      case 46:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 46>();
      case 47:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 47>();
      case 48:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 48>();
      case 49:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 49>();
      case 50:
        return detail::HardcodedQuadRule<base::RefEl::kTria(), 50>();
      default:
        // Create a quadrule using tensor product quadrature rule + duffy
        // transform
        const quadDegree_t n = degree / 2 + 1;
        auto [leg_p, leg_w] = GaussLegendre(n);
        auto [jac_p, jac_w] = GaussJacobi(n, 1, 0);
        jac_p.array() = (jac_p.array() + 1) / 2.;  // rescale to [0,1]
        jac_w.array() *= 0.25;
        Eigen::MatrixXd points2d(2, n * n);
        points2d.row(0) = Eigen::kroneckerProduct(
            leg_p.transpose(), (1 - jac_p.transpose().array()).matrix());
        points2d.row(1) = jac_p.transpose().replicate(1, n);
        return QuadRule(base::RefEl::kTria(), std::move(points2d),
                        Eigen::kroneckerProduct(leg_w, jac_w), 2 * n - 1);
    }
  }
  LF_VERIFY_MSG(
      false, "No Quadrature rules implemented for this reference element yet.");
}